

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_duplicates_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::RemoveDuplicatesPass::RemoveDuplicatesExtInstImports(RemoveDuplicatesPass *this)

{
  Module *pMVar1;
  IRContext *this_00;
  RemoveDuplicatesPass *pRVar2;
  bool bVar3;
  uint32_t before;
  Operand *this_01;
  Instruction *this_02;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ext_inst_imports;
  uint32_t local_94;
  RemoveDuplicatesPass *local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_88;
  string local_50;
  
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  this_02 = *(Instruction **)
             ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> +
             0x10);
  if (this_02 ==
      (Instruction *)
      ((long)&(pMVar1->ext_inst_imports_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    bVar3 = false;
  }
  else {
    local_88._M_buckets = &local_88._M_single_bucket;
    local_88._M_bucket_count = 1;
    local_88._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_88._M_element_count = 0;
    local_88._M_rehash_policy._M_max_load_factor = 1.0;
    local_88._M_rehash_policy._M_next_resize = 0;
    local_88._M_single_bucket = (__node_base_ptr)0x0;
    bVar3 = false;
    local_90 = this;
    while (this_02 != (Instruction *)0x0) {
      this_01 = Instruction::GetInOperand(this_02,0);
      Operand::AsString_abi_cxx11_(&local_50,this_01);
      local_94 = Instruction::result_id(this_02);
      pVar4 = std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::__cxx11::string,unsigned_int>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&local_88,&local_50,&local_94);
      std::__cxx11::string::_M_dispose();
      pRVar2 = local_90;
      if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        this_00 = (local_90->super_Pass).context_;
        before = Instruction::result_id(this_02);
        IRContext::ReplaceAllUsesWith
                  (this_00,before,
                   *(uint32_t *)
                    ((long)pVar4.first.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                    + 0x28));
        this_02 = IRContext::KillInst((pRVar2->super_Pass).context_,this_02);
        bVar3 = true;
      }
      else {
        this_02 = (this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((this_02->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          this_02 = (Instruction *)0x0;
        }
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_88);
  }
  return bVar3;
}

Assistant:

bool RemoveDuplicatesPass::RemoveDuplicatesExtInstImports() const {
  bool modified = false;

  if (context()->ext_inst_imports().empty()) {
    return modified;
  }

  std::unordered_map<std::string, spv::Id> ext_inst_imports;
  for (auto* i = &*context()->ext_inst_import_begin(); i;) {
    auto res = ext_inst_imports.emplace(i->GetInOperand(0u).AsString(),
                                        i->result_id());
    if (res.second) {
      // Never seen before, keep it.
      i = i->NextNode();
    } else {
      // It's a duplicate, remove it.
      context()->ReplaceAllUsesWith(i->result_id(), res.first->second);
      i = context()->KillInst(i);
      modified = true;
    }
  }

  return modified;
}